

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O2

SNMP_ERROR_STATUS
ValueCallback::setValueForCallback(ValueCallback *callback,shared_ptr<BER_CONTAINER> *value)

{
  SNMP_ERROR_STATUS SVar1;
  
  if (callback->isSettable == true) {
    SVar1 = (*callback->_vptr_ValueCallback[1])
                      (callback,(value->
                                super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr);
    if (SVar1 == NO_ERROR) {
      callback->setOccurred = true;
      SVar1 = NO_ERROR;
    }
    return SVar1;
  }
  return READ_ONLY;
}

Assistant:

SNMP_ERROR_STATUS ValueCallback::setValueForCallback(ValueCallback* callback, const std::shared_ptr<BER_CONTAINER> &value){
    SNMP_LOGD("Setting value for callback of OID: %s\n", callback->OID->string().c_str());

    if(!callback->isSettable){
        return SETTING_NON_SETTABLE_ERROR;
    }

    SNMP_ERROR_STATUS valid = callback->setTypeWithValue(value.get());

    if(valid == NO_ERROR){
        callback->setOccurred = true;
    }

    return valid;
}